

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_fence_acquire(ma_fence *pFence)

{
  ma_uint32 mVar1;
  ma_uint32 mVar2;
  bool bVar3;
  ma_uint32 newCounter;
  ma_uint32 oldCounter;
  ma_fence *pFence_local;
  ma_result local_4;
  
  if (pFence == (ma_fence *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    do {
      mVar1 = pFence->counter;
      if (0x7fffffff < mVar1 + 1) {
        return MA_OUT_OF_RANGE;
      }
      LOCK();
      mVar2 = pFence->counter;
      bVar3 = mVar1 == mVar2;
      if (bVar3) {
        pFence->counter = mVar1 + 1;
        mVar2 = mVar1;
      }
      UNLOCK();
      if (bVar3) {
        return MA_SUCCESS;
      }
    } while (mVar2 != 0x7fffffff);
    local_4 = MA_OUT_OF_RANGE;
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_fence_acquire(ma_fence* pFence)
{
    if (pFence == NULL) {
        return MA_INVALID_ARGS;
    }

    for (;;) {
        ma_uint32 oldCounter = ma_atomic_load_32(&pFence->counter);
        ma_uint32 newCounter = oldCounter + 1;

        /* Make sure we're not about to exceed our maximum value. */
        if (newCounter > MA_FENCE_COUNTER_MAX) {
            MA_ASSERT(MA_FALSE);
            return MA_OUT_OF_RANGE;
        }

        if (ma_atomic_compare_exchange_weak_32(&pFence->counter, &oldCounter, newCounter)) {
            return MA_SUCCESS;
        } else {
            if (oldCounter == MA_FENCE_COUNTER_MAX) {
                MA_ASSERT(MA_FALSE);
                return MA_OUT_OF_RANGE; /* The other thread took the last available slot. Abort. */
            }
        }
    }

    /* Should never get here. */
    /*return MA_SUCCESS;*/
}